

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

void FinishDehPatch(void)

{
  PClassActor *pPVar1;
  PClass *this;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  PClassActor **ppPVar5;
  AActor *__src;
  char *pcVar6;
  char *pcVar7;
  bool *pbVar8;
  int local_108;
  uint local_104;
  int use;
  uint j;
  bool *check;
  FState *local_f0;
  FState *state;
  TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_> StateVisited;
  TFlags<ActorFlag6,_unsigned_int> local_c8;
  byte local_c1;
  AActor *pAStack_c0;
  bool found;
  AWeapon *weap;
  PClassActor *pPStack_b0;
  uint i;
  PClassActor *old_replacement;
  undefined1 local_98 [8];
  FStateDefinitions statedef;
  AActor *defaults2;
  PClassActor *local_50;
  PClassActor *subclass;
  char typeNameBuilder [32];
  AActor *defaults1;
  PClassActor *type;
  uint touchedIndex;
  
  for (type._4_4_ = 0; uVar3 = TArray<PClassActor_*,_PClassActor_*>::Size(&TouchedActors),
      type._4_4_ < uVar3; type._4_4_ = type._4_4_ + 1) {
    ppPVar5 = TArray<PClassActor_*,_PClassActor_*>::operator[](&TouchedActors,(ulong)type._4_4_);
    pPVar1 = *ppPVar5;
    __src = GetDefaultByType(&pPVar1->super_PClass);
    TFlags<ActorFlag,_unsigned_int>::operator&
              ((TFlags<ActorFlag,_unsigned_int> *)(typeNameBuilder + 0x1c),
               (int)__src + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)(typeNameBuilder + 0x1c));
    if (uVar3 != 0) {
      mysnprintf((char *)&subclass,0x20,"DehackedPickup%d",(ulong)type._4_4_);
      this = ADehackedPickup::RegistrationInfo.MyClass;
      FName::FName((FName *)((long)&defaults2 + 4),(char *)&subclass);
      local_50 = (PClassActor *)
                 PClass::CreateDerivedClass(this,(FName *)((long)&defaults2 + 4),0x4f0);
      statedef.StateArray._8_8_ = GetDefaultByType((PClass *)local_50);
      memcpy((void *)statedef.StateArray._8_8_,__src,0x4a0);
      FStateDefinitions::FStateDefinitions((FStateDefinitions *)local_98);
      FStateDefinitions::MakeStateDefines((FStateDefinitions *)local_98,pPVar1);
      bVar2 = PClass::IsDescendantOf(&pPVar1->super_PClass,AInventory::RegistrationInfo.MyClass);
      if (!bVar2) {
        FStateDefinitions::AddStateDefines
                  ((FStateDefinitions *)local_98,
                   *(FStateLabels **)
                    &AInventory::RegistrationInfo.MyClass[1].super_PStruct.super_PNamedType.
                     super_PCompoundType.super_PType.Align);
      }
      FStateDefinitions::InstallStates
                ((FStateDefinitions *)local_98,local_50,(AActor *)statedef.StateArray._8_8_);
      pPStack_b0 = pPVar1->Replacement;
      pPVar1->Replacement = local_50;
      local_50->Replacee = pPVar1;
      if (pPStack_b0 != (PClassActor *)0x0) {
        local_50->Replacement = pPStack_b0;
      }
      pcVar6 = FName::GetChars(&(local_50->super_PClass).super_PStruct.super_PNamedType.TypeName);
      pcVar7 = FName::GetChars(&(pPVar1->super_PClass).super_PStruct.super_PNamedType.TypeName);
      DPrintf(3,"%s replaces %s\n",pcVar6,pcVar7);
      FStateDefinitions::~FStateDefinitions((FStateDefinitions *)local_98);
    }
  }
  TArray<StateMapper,_StateMapper>::Clear(&StateMap);
  TArray<StateMapper,_StateMapper>::ShrinkToFit(&StateMap);
  TArray<PClassActor_*,_PClassActor_*>::Clear(&TouchedActors);
  TArray<PClassActor_*,_PClassActor_*>::ShrinkToFit(&TouchedActors);
  weap._4_4_ = 0;
  do {
    uVar3 = weap._4_4_;
    uVar4 = TArray<PClassActor_*,_PClassActor_*>::Size(&WeaponNames);
    if (uVar4 <= uVar3) {
      TArray<PClassActor_*,_PClassActor_*>::Clear(&WeaponNames);
      TArray<PClassActor_*,_PClassActor_*>::ShrinkToFit(&WeaponNames);
      return;
    }
    ppPVar5 = TArray<PClassActor_*,_PClassActor_*>::operator[](&WeaponNames,(ulong)weap._4_4_);
    pAStack_c0 = GetDefaultByType(&(*ppPVar5)->super_PClass);
    local_c1 = 0;
    TFlags<ActorFlag6,_unsigned_int>::operator&
              (&local_c8,(int)pAStack_c0 + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_BUMPSPECIAL));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_c8);
    if (uVar3 == 0) {
      *(uint *)((long)&pAStack_c0[1].snext + 4) =
           *(uint *)((long)&pAStack_c0[1].snext + 4) | 0x10000;
      *(undefined4 *)&pAStack_c0[1].OldRenderPos.X = 0;
      TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>::TMap
                ((TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_> *)&state);
      ppPVar5 = TArray<PClassActor_*,_PClassActor_*>::operator[](&WeaponNames,(ulong)weap._4_4_);
      pPVar1 = *ppPVar5;
      FName::FName((FName *)((long)&check + 4),NAME_Fire);
      local_f0 = PClassActor::FindState(pPVar1,(FName *)((long)&check + 4));
      while ((local_f0 != (FState *)0x0 &&
             ((pbVar8 = TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>::CheckKey
                                  ((TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>
                                    *)&state,local_f0), pbVar8 == (bool *)0x0 ||
              ((*pbVar8 & 1U) == 0))))) {
        pbVar8 = TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>::operator[]
                           ((TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_> *)
                            &state,local_f0);
        *pbVar8 = true;
        local_104 = 0;
        while (AmmoPerAttacks[local_104].func != (VMNativeFunction **)0x0) {
          if ((VMNativeFunction *)local_f0->ActionFunc == *AmmoPerAttacks[local_104].func) {
            local_c1 = 1;
            local_108 = AmmoPerAttacks[local_104].ammocount;
            if (local_108 < 0) {
              local_108 = deh.BFGCells;
            }
            *(int *)&pAStack_c0[1].OldRenderPos.X = local_108;
            break;
          }
          local_104 = local_104 + 1;
        }
        if ((local_c1 & 1) != 0) break;
        local_f0 = FState::GetNextState(local_f0);
      }
      TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>::~TMap
                ((TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_> *)&state);
    }
    else {
      operator~((int)&StateVisited + (MF6_NOFEAR|MF6_MTHRUSPECIES));
      TFlags<ActorFlag6,_unsigned_int>::operator&=
                (&pAStack_c0->flags6,(Self *)&StateVisited.NumUsed);
    }
    weap._4_4_ = weap._4_4_ + 1;
  } while( true );
}

Assistant:

void FinishDehPatch ()
{
	unsigned int touchedIndex;

	for (touchedIndex = 0; touchedIndex < TouchedActors.Size(); ++touchedIndex)
	{
		PClassActor *type = TouchedActors[touchedIndex];
		AActor *defaults1 = GetDefaultByType (type);
		if (!(defaults1->flags & MF_SPECIAL))
		{ // We only need to do this for pickups
			continue;
		}

		// Create a new class that will serve as the actual pickup
		char typeNameBuilder[32];
		mysnprintf (typeNameBuilder, countof(typeNameBuilder), "DehackedPickup%d", touchedIndex);
		PClassActor *subclass = static_cast<PClassActor *>(RUNTIME_CLASS(ADehackedPickup)->
			CreateDerivedClass(typeNameBuilder, sizeof(ADehackedPickup)));
		AActor *defaults2 = GetDefaultByType (subclass);
		memcpy ((void *)defaults2, (void *)defaults1, sizeof(AActor));

		// Make a copy of the replaced class's state labels 
		FStateDefinitions statedef;
		statedef.MakeStateDefines(type);

		if (!type->IsDescendantOf(RUNTIME_CLASS(AInventory)))
		{
			// If this is a hacked non-inventory item we must also copy AInventory's special states
			statedef.AddStateDefines(RUNTIME_CLASS(AInventory)->StateList);
		}
		statedef.InstallStates(subclass, defaults2);

		// Use the DECORATE replacement feature to redirect all spawns
		// of the original class to the new one.
		PClassActor *old_replacement = type->Replacement;

		type->Replacement = subclass;
		subclass->Replacee = type;
		// If this actor was already replaced by another actor, copy that
		// replacement over to this item.
		if (old_replacement != NULL)
		{
			subclass->Replacement = old_replacement;
		}

		DPrintf (DMSG_NOTIFY, "%s replaces %s\n", subclass->TypeName.GetChars(), type->TypeName.GetChars());
	}

	// Now that all Dehacked patches have been processed, it's okay to free StateMap.
	StateMap.Clear();
	StateMap.ShrinkToFit();
	TouchedActors.Clear();
	TouchedActors.ShrinkToFit();

	// Now it gets nasty: We have to fiddle around with the weapons' ammo use info to make Doom's original
	// ammo consumption work as intended.

	for(unsigned i = 0; i < WeaponNames.Size(); i++)
	{
		AWeapon *weap = (AWeapon*)GetDefaultByType(WeaponNames[i]);
		bool found = false;
		if (weap->flags6 & MF6_INTRYMOVE)
		{
			// Weapon sets an explicit amount of ammo to use so we won't need any special processing here
			weap->flags6 &= ~MF6_INTRYMOVE;
		}
		else
		{
			weap->WeaponFlags |= WIF_DEHAMMO;
			weap->AmmoUse1 = 0;
			// to allow proper checks in CheckAmmo we have to find the first attack pointer in the Fire sequence
			// and set its default ammo use as the weapon's AmmoUse1.

			TMap<FState*, bool> StateVisited;

			FState *state = WeaponNames[i]->FindState(NAME_Fire);
			while (state != NULL)
			{
				bool *check = StateVisited.CheckKey(state);
				if (check != NULL && *check)
				{
					break;	// State has already been checked so we reached a loop
				}
				StateVisited[state] = true;
				for(unsigned j = 0; AmmoPerAttacks[j].func != NULL; j++)
				{
					if (state->ActionFunc == *AmmoPerAttacks[j].func)
					{
						found = true;
						int use = AmmoPerAttacks[j].ammocount;
						if (use < 0) use = deh.BFGCells;
						weap->AmmoUse1 = use;
						break;
					}
				}
				if (found) break;
				state = state->GetNextState();
			}
		}
	}
	WeaponNames.Clear();
	WeaponNames.ShrinkToFit();
}